

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O3

void * __thiscall
google::protobuf::internal::ExtensionSet::MutableRawRepeatedField(ExtensionSet *this,int number)

{
  _Base_ptr p_Var1;
  LogMessage *pLVar2;
  _Base_ptr p_Var3;
  _Rb_tree_header *p_Var4;
  LogFinisher local_51;
  LogMessage local_50;
  
  p_Var3 = (this->extensions_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var4 = &(this->extensions_)._M_t._M_impl.super__Rb_tree_header;
  p_Var1 = &p_Var4->_M_header;
  if (p_Var3 != (_Base_ptr)0x0) {
    do {
      if (number <= (int)p_Var3[1]._M_color) {
        p_Var1 = p_Var3;
      }
      p_Var3 = (&p_Var3->_M_left)[(int)p_Var3[1]._M_color < number];
    } while (p_Var3 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var1 != p_Var4) && ((int)p_Var1[1]._M_color <= number))
    goto LAB_001fee07;
  }
  LogMessage::LogMessage
            (&local_50,LOGLEVEL_DFATAL,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/extension_set.cc"
             ,0x137);
  pLVar2 = LogMessage::operator<<(&local_50,"CHECK failed: iter != extensions_.end(): ");
  pLVar2 = LogMessage::operator<<(pLVar2,"no extension numbered ");
  pLVar2 = LogMessage::operator<<(pLVar2,number);
  LogFinisher::operator=(&local_51,pLVar2);
  LogMessage::~LogMessage(&local_50);
  p_Var1 = &p_Var4->_M_header;
LAB_001fee07:
  return p_Var1[1]._M_parent;
}

Assistant:

void* ExtensionSet::MutableRawRepeatedField(int number) {
  // We assume that all the RepeatedField<>* pointers have the same
  // size and alignment within the anonymous union in Extension.
  map<int, Extension>::const_iterator iter = extensions_.find(number);
  GOOGLE_CHECK(iter != extensions_.end()) << "no extension numbered " << number;
  return iter->second.repeated_int32_value;
}